

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.h
# Opt level: O2

NormalizerSpec * __thiscall
sentencepiece::ModelProto::_internal_mutable_normalizer_spec(ModelProto *this)

{
  NormalizerSpec *pNVar1;
  Arena *arena;
  
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
  if (this->normalizer_spec_ != (NormalizerSpec *)0x0) {
    return this->normalizer_spec_;
  }
  arena = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pNVar1 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::NormalizerSpec>(arena);
  this->normalizer_spec_ = pNVar1;
  return pNVar1;
}

Assistant:

inline ::sentencepiece::NormalizerSpec* ModelProto::_internal_mutable_normalizer_spec() {
  _has_bits_[0] |= 0x00000002u;
  if (normalizer_spec_ == nullptr) {
    auto* p = CreateMaybeMessage<::sentencepiece::NormalizerSpec>(GetArena());
    normalizer_spec_ = p;
  }
  return normalizer_spec_;
}